

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc1.c
# Opt level: O0

uint8_t mbc1_read(gb_cart_t *cart,uint16_t addr)

{
  ushort uVar1;
  int local_30;
  int offset_1;
  int offset;
  mbc1_state_t *state;
  uint16_t addr_local;
  gb_cart_t *cart_local;
  
  if (cart != (gb_cart_t *)0x0) {
    uVar1 = addr & 0xf000;
    if (((((addr & 0xf000) == 0) || (uVar1 == 0x1000)) || (uVar1 == 0x2000)) || (uVar1 == 0x3000)) {
      cart_local._7_1_ = cart->rom[addr];
    }
    else if (((uVar1 == 0x4000) || (uVar1 == 0x5000)) || ((uVar1 == 0x6000 || (uVar1 == 0x7000)))) {
      cart_local._7_1_ = cart->rom[(int)(cart->curr_rom_bank * 0x4000 + (uint)addr + -0x4000)];
    }
    else if ((uVar1 == 0xa000) || (uVar1 == 0xb000)) {
      if ((*cart->mbc_state & 1) == 0) {
        cart_local._7_1_ = 0xff;
      }
      else {
        local_30 = 0;
        if ((*(byte *)((long)cart->mbc_state + 1) & 1) == 0) {
          local_30 = cart->curr_ram_bank << 0xd;
        }
        cart_local._7_1_ = cart->ram[(int)(local_30 + (uint)addr + -0xa000)];
      }
    }
    else {
      cart_local._7_1_ = 0xff;
    }
    return cart_local._7_1_;
  }
  __assert_fail("cart != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc1.c"
                ,0x2f,"uint8_t mbc1_read(gb_cart_t *, uint16_t)");
}

Assistant:

uint8_t mbc1_read(gb_cart_t *cart, uint16_t addr)
{
    assert(cart != NULL);

    mbc1_state_t *state = (mbc1_state_t*)cart->mbc_state;

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
    case 0x2000:
    case 0x3000:
        // ROM bank 0 in mode 0
        return cart->rom[addr];

    case 0x4000:
    case 0x5000:
    case 0x6000:
    case 0x7000:
    {
        // Switchable ROM bank
        int offset = cart->curr_rom_bank * ROM_BANK_SIZE;
        return cart->rom[offset + addr - 0x4000];
    }
    
    case 0xA000:
    case 0xB000:
        // External RAM
        if (state->ram_enabled)
        {
            int offset = 0;
            if (!state->second_mode)
                offset = cart->curr_ram_bank * SRAM_BANK_SIZE;

            return cart->ram[offset + addr - 0xA000];
        }
        else
            return 0xFF;
    
    default:
        return 0xFF;
    }
}